

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>
  pvVar1;
  EnumDescriptor *descriptor_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  OneofDescriptor *pOVar2;
  DescriptorProto *pDVar3;
  FieldDescriptor *pFVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar5;
  Descriptor *descriptor_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar6;
  int i;
  int iVar7;
  undefined8 *puVar8;
  FileDescriptor *local_68;
  LifetimesInfo local_60;
  
  if (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
    local_60.full_name._M_str = (descriptor->all_names_).payload_;
    local_68 = descriptor->file_;
    local_60.full_name._M_len = (size_t)*(ushort *)(local_60.full_name._M_str + 2);
    puVar8 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
    local_60.filename._M_str = (char *)*puVar8;
    local_60.filename._M_len = puVar8[1];
    local_60.full_name._M_str = local_60.full_name._M_str + ~local_60.full_name._M_len;
    local_60.proto_features = descriptor->proto_features_;
    local_60.proto = &proto->super_Message;
    pvVar1 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
             ::
             operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                         *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_68);
    std::
    vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
    ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
              (pvVar1,&local_60);
  }
  for (iVar7 = 0; iVar7 < descriptor->enum_type_count_; iVar7 = iVar7 + 1) {
    descriptor_00 = Descriptor::enum_type(descriptor,iVar7);
    proto_00 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,iVar7);
    Visit<google::protobuf::EnumDescriptorProto_const>(this,descriptor_00,proto_00);
  }
  for (iVar7 = 0; iVar7 < descriptor->oneof_decl_count_; iVar7 = iVar7 + 1) {
    pOVar2 = Descriptor::oneof_decl(descriptor,iVar7);
    pDVar3 = (DescriptorProto *)
             RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                       (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar7);
    if (pOVar2->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
      local_60.full_name._M_str = (pOVar2->all_names_).payload_;
      local_68 = pOVar2->containing_type_->file_;
      local_60.full_name._M_len = (size_t)*(ushort *)(local_60.full_name._M_str + 2);
      puVar8 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
      local_60.filename._M_str = (char *)*puVar8;
      local_60.filename._M_len = puVar8[1];
      local_60.full_name._M_str = local_60.full_name._M_str + ~local_60.full_name._M_len;
      local_60.proto_features = pOVar2->proto_features_;
      local_60.proto = (Message *)pDVar3;
      pvVar1 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
               ::
               operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                           *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_68);
      std::
      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
      ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                (pvVar1,&local_60);
    }
  }
  for (iVar7 = 0; iVar7 < descriptor->field_count_; iVar7 = iVar7 + 1) {
    pFVar4 = Descriptor::field(descriptor,iVar7);
    pVVar5 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar7);
    Visit<google::protobuf::FieldDescriptorProto_const>(this,pFVar4,pVVar5);
  }
  for (iVar7 = 0; iVar7 < descriptor->nested_type_count_; iVar7 = iVar7 + 1) {
    descriptor_01 = Descriptor::nested_type(descriptor,iVar7);
    proto_01 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,iVar7);
    Visit<google::protobuf::DescriptorProto_const>(this,descriptor_01,proto_01);
  }
  for (iVar7 = 0; iVar7 < descriptor->extension_count_; iVar7 = iVar7 + 1) {
    pFVar4 = Descriptor::extension(descriptor,iVar7);
    pVVar5 = RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar7);
    Visit<google::protobuf::FieldDescriptorProto_const>(this,pFVar4,pVVar5);
  }
  for (iVar7 = 0; iVar7 < descriptor->extension_range_count_; iVar7 = iVar7 + 1) {
    pEVar6 = Descriptor::extension_range(descriptor,iVar7);
    pDVar3 = (DescriptorProto *)
             RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                       (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar7);
    if (pEVar6->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
      local_60.full_name._M_str = (pEVar6->containing_type_->all_names_).payload_;
      local_68 = pEVar6->containing_type_->file_;
      local_60.full_name._M_len = (size_t)*(ushort *)(local_60.full_name._M_str + 2);
      puVar8 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
      local_60.filename._M_str = (char *)*puVar8;
      local_60.filename._M_len = puVar8[1];
      local_60.full_name._M_str = local_60.full_name._M_str + ~local_60.full_name._M_len;
      local_60.proto_features = pEVar6->proto_features_;
      local_60.proto = (Message *)pDVar3;
      pvVar1 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
               ::
               operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                           *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_68);
      std::
      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
      ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                (pvVar1,&local_60);
    }
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }